

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_type.hpp
# Opt level: O3

void duckdb::Bit::RightShift(bitstring_t *bit_string,idx_t shift,bitstring_t *result)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  byte bVar7;
  ulong uVar8;
  int iVar9;
  char *buf;
  byte *pbVar10;
  ulong uVar11;
  byte bVar12;
  undefined8 local_40;
  byte *local_38;
  
  pcVar1 = (result->value).pointer.prefix;
  pcVar4 = pcVar1;
  if (0xc < (result->value).pointer.length) {
    pcVar4 = (result->value).pointer.ptr;
  }
  if ((bit_string->value).pointer.length < 0xd) {
    pcVar5 = (bit_string->value).pointer.prefix;
  }
  else {
    pcVar5 = (bit_string->value).pointer.ptr;
  }
  *pcVar4 = *pcVar5;
  pcVar4 = (result->value).pointer.ptr;
  pcVar5 = pcVar4;
  if ((result->value).pointer.length < 0xd) {
    pcVar5 = pcVar1;
  }
  uVar8 = (ulong)(byte)*pcVar5;
  iVar9 = -(int)shift;
  lVar6 = -shift;
  uVar11 = 0;
  do {
    uVar2 = *(ulong *)&result->value;
    uVar3 = (uint)uVar2;
    if (uVar3 < 0xd) {
      bVar12 = (byte)(uVar2 >> 0x20);
    }
    else {
      bVar12 = *pcVar4;
    }
    if (((uVar2 & 0xffffffff) * 8 - (ulong)bVar12) - 8 <= uVar11) {
      Finalize(result);
      return;
    }
    if (uVar11 < shift) {
      if (uVar3 < 0xd) {
        pcVar4 = pcVar1;
      }
      bVar12 = ~(byte)uVar8 & 7;
      bVar7 = -2 << bVar12 | 0xfeU >> 8 - bVar12;
LAB_012e9a92:
      pcVar4[(uVar8 >> 3) + 1] = pcVar4[(uVar8 >> 3) + 1] & bVar7;
    }
    else {
      local_40 = *(undefined8 *)&bit_string->value;
      local_38 = (byte *)(bit_string->value).pointer.ptr;
      if ((uint)local_40 < 0xd) {
        bVar12 = (byte)((ulong)local_40 >> 0x20);
        pbVar10 = (byte *)((long)&local_40 + 4);
      }
      else {
        bVar12 = *local_38;
        pbVar10 = local_38;
      }
      if (uVar3 < 0xd) {
        pcVar4 = pcVar1;
      }
      bVar7 = '\x01' << (~(byte)uVar8 & 7);
      if ((pbVar10[(lVar6 + (ulong)bVar12 >> 3) + 1] >> (~(bVar12 + (char)iVar9) & 7) & 1) == 0) {
        bVar7 = ~bVar7;
        goto LAB_012e9a92;
      }
      pcVar4[(uVar8 >> 3) + 1] = pcVar4[(uVar8 >> 3) + 1] | bVar7;
    }
    uVar11 = uVar11 + 1;
    pcVar4 = (result->value).pointer.ptr;
    iVar9 = iVar9 + 1;
    lVar6 = lVar6 + 1;
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

char *GetDataWriteable() const {
		return IsInlined() ? (char *)value.inlined.inlined : value.pointer.ptr; // NOLINT
	}